

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week6-app3.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  int local_44;
  int i;
  FiboGenerator fg;
  int cnt;
  anon_class_1_0_00000001 greater_than_1;
  array<int,_5UL> a;
  char **argv_local;
  int argc_local;
  
  _cnt = 0x200000001;
  transform<std::array<int,5ul>,main::__0>(&cnt);
  fg.b = count_if<std::array<int,5ul>,main::__1>(&cnt);
  poVar2 = std::operator<<((ostream *)&std::cout,"Count=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,fg.b);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  memset(&stack0xffffffffffffffc0,0,8);
  FiboGenerator::FiboGenerator((FiboGenerator *)&stack0xffffffffffffffc0);
  for (local_44 = 0; local_44 < 10; local_44 = local_44 + 1) {
    iVar1 = FiboGenerator::operator()((FiboGenerator *)&stack0xffffffffffffffc0);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::operator<<(poVar2," ");
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    auto a = array<int, 5>{1, 2, 3, 4, 5};
    transform(a, [](int& a) { ++a; }); // a is now {2, 3, 4, 5, 6}

//    auto greater_than_3 = GreaterThan3();
//    auto greater_than_3 = [](int value) { return value > 3; };
    auto greater_than_1 = [](int value) { return value > 1; };

    auto cnt = count_if(a, greater_than_1);
    cout << "Count=" << cnt << endl;

    auto fg = FiboGenerator();
    for(int i=0; i<10; ++i)
        cout << fg() << " ";
    cout << endl;

    return 0;
}